

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O0

double FindLocalLayerHeight
                 (vector<vector3,_std::allocator<vector3>_> *existing_layer,vector3 *test_vertex,
                 bool is_first_layer)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  vector3 local_88;
  int local_6c;
  double dStack_68;
  int i;
  double temp_distance;
  double minimun_distance;
  vector3 nearest_vertex;
  vector3 temp_vertex;
  bool is_first_layer_local;
  vector3 *test_vertex_local;
  vector<vector3,_std::allocator<vector3>_> *existing_layer_local;
  
  if (is_first_layer) {
    existing_layer_local = (vector<vector3,_std::allocator<vector3>_> *)test_vertex->z;
  }
  else {
    vector3::vector3((vector3 *)&nearest_vertex.z);
    vector3::vector3((vector3 *)&minimun_distance);
    temp_distance = 1000.0;
    local_6c = 0;
    while( true ) {
      uVar3 = (ulong)local_6c;
      sVar4 = std::vector<vector3,_std::allocator<vector3>_>::size(existing_layer);
      if (sVar4 <= uVar3) break;
      pvVar5 = std::vector<vector3,_std::allocator<vector3>_>::operator[]
                         (existing_layer,(long)local_6c);
      nearest_vertex.z = pvVar5->x;
      dVar1 = pvVar5->y;
      dVar2 = pvVar5->z;
      vector3::operator-(&local_88,test_vertex,(vector3 *)&nearest_vertex.z);
      dStack_68 = vector3::XYLength(&local_88);
      if (dStack_68 < temp_distance) {
        minimun_distance = nearest_vertex.z;
        temp_distance = dStack_68;
        nearest_vertex.x = dVar1;
        nearest_vertex.y = dVar2;
      }
      local_6c = local_6c + 1;
    }
    existing_layer_local =
         (vector<vector3,_std::allocator<vector3>_> *)(test_vertex->z - nearest_vertex.y);
  }
  return (double)existing_layer_local;
}

Assistant:

double FindLocalLayerHeight(std::vector<vector3> *existing_layer, vector3 &test_vertex, bool is_first_layer)
{
  if (is_first_layer)
  {
    return test_vertex.z;
  }

  vector3 temp_vertex, nearest_vertex;
  double minimun_distance = 1000, temp_distance;
  for (int i = 0; i < existing_layer->size(); i++)
  {
    temp_vertex = (*existing_layer)[i];
    temp_distance = (test_vertex - temp_vertex).XYLength();
    if (temp_distance < minimun_distance)
    {
      minimun_distance = temp_distance;
      nearest_vertex = temp_vertex;
    }
  }

  return test_vertex.z - nearest_vertex.z;
}